

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O0

void __thiscall
ParserTest_InvalidUnaryThrows_Test::TestBody(ParserTest_InvalidUnaryThrows_Test *this)

{
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *in_stack_000001a8;
  string *in_stack_000001b0;
  offset_in_Parser_to_subr *in_stack_ffffffffffffff38;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *in_stack_ffffffffffffff40;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> local_91;
  string local_90 [32];
  code *local_70;
  undefined8 local_68;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  local_70 = Parser::parseUnary;
  local_68 = 0;
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  testThrow(in_stack_000001b0,in_stack_000001a8);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cb2bc);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x0,
             (offset_in_Parser_to_subr *)Parser::parseUnary);
  testThrow(in_stack_000001b0,in_stack_000001a8);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1cb33f);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

TEST(ParserTest, InvalidUnaryThrows)
{
  testThrow("+x", &Parser::parseUnary);
  testThrow("--4", &Parser::parseUnary);
}